

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strftime_format.cpp
# Opt level: O2

string * duckdb::StrpTimeFormat::FormatStrpTimeError
                   (string *__return_storage_ptr__,string *input,optional_idx position)

{
  idx_t iVar1;
  optional_idx position_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28;
  
  if (position.index == 0xffffffffffffffff) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    position_local = position;
    ::std::operator+(&local_48,input,anon_var_dwarf_3b657a3 + 8);
    iVar1 = optional_idx::GetIndex(&position_local);
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    ::std::__cxx11::string::_M_construct((ulong)&local_68,(char)iVar1);
    ::std::operator+(&local_28,&local_48,&local_68);
    ::std::operator+(__return_storage_ptr__,&local_28,"^");
    ::std::__cxx11::string::~string((string *)&local_28);
    ::std::__cxx11::string::~string((string *)&local_68);
    ::std::__cxx11::string::~string((string *)&local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

string StrpTimeFormat::FormatStrpTimeError(const string &input, optional_idx position) {
	if (!position.IsValid()) {
		return string();
	}
	return input + "\n" + string(position.GetIndex(), ' ') + "^";
}